

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O1

void __thiscall test_test::test_wchar_t_compare::test_method(test_wchar_t_compare *this)

{
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_wchar_t_compare)
{
    wchar_t lwa1[] = L"World";
    wchar_t rwa1[] = L"World";
    const wchar_t lcwa2[] = L"World", rcwa2[] = L"World";
    const wchar_t *lcwp3 = L"World";
    const wchar_t *rcwp3 = L"World";
    const wchar_t * const lcwpc4 = L"World";
    const wchar_t * const rcwpc4 = L"World";

    // BOOST_CHECK_EQUAL(L"World", L"World");
    // BOOST_CHECK_EQUAL(L"World", rwa1);
    // BOOST_CHECK_EQUAL(L"World", rcwa2);
    // BOOST_CHECK_EQUAL(L"World", rcwp3);
    // BOOST_CHECK_EQUAL(L"World", rcwpc4);

    // BOOST_CHECK_EQUAL(lwa1, L"World");
    // BOOST_CHECK_EQUAL(lwa1, rwa1);
    // BOOST_CHECK_EQUAL(lwa1, rcwa2);
    // BOOST_CHECK_EQUAL(lwa1, rcwp3);
    // BOOST_CHECK_EQUAL(lwa1, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwa2, L"World");
    // BOOST_CHECK_EQUAL(lcwa2, rwa1);
    // BOOST_CHECK_EQUAL(lcwa2, rcwa2);
    // BOOST_CHECK_EQUAL(lcwa2, rcwp3);
    // BOOST_CHECK_EQUAL(lcwa2, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwp3, L"World");
    // BOOST_CHECK_EQUAL(lcwp3, rwa1);
    // BOOST_CHECK_EQUAL(lcwp3, rcwa2);
    // BOOST_CHECK_EQUAL(lcwp3, rcwp3);
    // BOOST_CHECK_EQUAL(lcwp3, rcwpc4);

    // BOOST_CHECK_EQUAL(lcwpc4, L"World");
    // BOOST_CHECK_EQUAL(lcwpc4, rwa1);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwa2);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwp3);
    // BOOST_CHECK_EQUAL(lcwpc4, rcwpc4);
}